

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

void __thiscall Corrade::Utility::StringStream::sync(StringStream *this)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  String local_40;
  _func_void_char_ptr_size_t *local_28;
  Deleter deleter;
  StringStream *local_18;
  StringStream *this_local;
  
  local_18 = this;
  pcVar2 = Containers::Array::operator_cast_to_char_((Array *)&(this->super_ostream).field_0x48);
  if (pcVar2 != (char *)0x0) {
    lVar1 = *(long *)&(this->super_ostream).field_0x68;
    lVar3 = std::streambuf::pptr();
    lVar4 = std::streambuf::pbase();
    Containers::arrayResize<char,Corrade::Containers::ArrayMallocAllocator<char>>
              (&(this->super_ostream).field_0x48,(lVar3 + lVar1) - lVar4);
    deleter._6_1_ = 0;
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&(this->super_ostream).field_0x48,
               (type_conflict2 *)((long)&deleter + 6));
    sVar5 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::size
                      ((Array<char,_void_(*)(char_*,_unsigned_long)> *)
                       &(this->super_ostream).field_0x48);
    *(size_t *)&(this->super_ostream).field_0x68 = sVar5 - 1;
    pcVar2 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::end
                       ((Array<char,_void_(*)(char_*,_unsigned_long)> *)
                        &(this->super_ostream).field_0x48);
    Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::end
              ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&(this->super_ostream).field_0x48);
    std::streambuf::setp(&(this->super_ostream).field_0x8,pcVar2 + -1);
    local_28 = (_func_void_char_ptr_size_t *)
               Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::deleter
                         ((Array<char,_void_(*)(char_*,_unsigned_long)> *)
                          &(this->super_ostream).field_0x48);
    pcVar2 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::release
                       ((Array<char,_void_(*)(char_*,_unsigned_long)> *)
                        &(this->super_ostream).field_0x48);
    Containers::String::String
              (&local_40,pcVar2,*(size_t *)&(this->super_ostream).field_0x68,local_28);
    Containers::String::operator=(*(String **)&(this->super_ostream).field_0x60,&local_40);
    Containers::String::~String(&local_40);
  }
  return;
}

Assistant:

int sync() override {
            /* If sync() gets called multiple times without any overflow() in
               between, the data are owned by the string, not the array, and
               the remaining capacity is artificially set to 0 in a setp() call
               to prevent it from being appended to. Exit early in that case as
               there's nothing left to be done. */
            if(!_data)
                return 0;

            /* Resize to just what had been written, add a null terminator at
               the end */
            /** @todo clean up once the string is capable of growing */
            arrayResize(_data, NoInit, _initialSize + pptr() - pbase());
            arrayAppend(_data, '\0');

            /* The above might have reallocated, for example when the _data had
               no space for the null terminator. Call setp() to update the
               pointers, but don't leave any extra capacity to force overflow()
               to be called for next append, which then adopts the string back
               to the array. Otherwise it would be impossible to distinguish
               whether the string was modified by the stream (causing pptr() to
               change) or from outside (causing pptr() to point to an outdated
               location). */
            _initialSize = _data.size() - 1;
            setp(_data.end() - 1, _data.end() - 1);

            /* Move the array guts back to the string, making it one byte
               smaller as the last byte is the null terminator */
            const Containers::Array<char>::Deleter deleter = _data.deleter();
            _out = Containers::String{_data.release(), _initialSize, deleter};

            return 0;
        }